

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.h
# Opt level: O3

bool __thiscall
google::protobuf::internal::ReflectionSchema::IsFieldInlined
          (ReflectionSchema *this,FieldDescriptor *field)

{
  FieldDescriptor **ppFVar1;
  
  if ((field->field_0x1 & 8) == 0) {
    ppFVar1 = &field->containing_type_->fields_;
  }
  else if ((field->scope_).extension_scope == (Descriptor *)0x0) {
    ppFVar1 = &field->file_->extensions_;
  }
  else {
    ppFVar1 = &((field->scope_).extension_scope)->extensions_;
  }
  if ((field->type_ != '\f') && (field->type_ != '\t')) {
    return false;
  }
  return (bool)((byte)this->offsets_
                      [(int)((ulong)((long)field - (long)*ppFVar1) >> 3) * -0x45d1745d] & 1);
}

Assistant:

inline int FieldDescriptor::index() const {
  if (!is_extension_) {
    return static_cast<int>(this - containing_type()->fields_);
  } else if (extension_scope() != nullptr) {
    return static_cast<int>(this - extension_scope()->extensions_);
  } else {
    return static_cast<int>(this - file_->extensions_);
  }
}